

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::type_is_bda_block_entry
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  SPIRType *pSVar1;
  
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + type_id)
  ;
  return pSVar1->storage == StorageClassPhysicalStorageBuffer &&
         *(int *)&(pSVar1->super_IVariant).field_0xc == 0x20;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::type_is_bda_block_entry(uint32_t type_id) const
{
	auto &type = compiler.get<SPIRType>(type_id);
	return compiler.is_physical_pointer(type);
}